

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_extension.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::ExtensionGenerator::ExtensionGenerator
          (ExtensionGenerator *this,string *root_class_name,FieldDescriptor *descriptor)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  ExtensionMethodName_abi_cxx11_(&this->method_name_,(objectivec *)descriptor,descriptor);
  std::operator+(&bStack_38,root_class_name,"_");
  std::operator+(&this->root_class_and_method_name_,&bStack_38,&this->method_name_);
  std::__cxx11::string::~string((string *)&bStack_38);
  this->descriptor_ = descriptor;
  bVar1 = FieldDescriptor::is_map(descriptor);
  if (!bVar1) {
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"error: Extension is a map<>!");
  poVar2 = std::operator<<(poVar2," That used to be blocked by the compiler.");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ostream::flush();
  abort();
}

Assistant:

ExtensionGenerator::ExtensionGenerator(const string& root_class_name,
                                       const FieldDescriptor* descriptor)
    : method_name_(ExtensionMethodName(descriptor)),
      root_class_and_method_name_(root_class_name + "_" + method_name_),
      descriptor_(descriptor) {
  if (descriptor->is_map()) {
    // NOTE: src/google/protobuf/compiler/plugin.cc makes use of cerr for some
    // error cases, so it seems to be ok to use as a back door for errors.
    cerr << "error: Extension is a map<>!"
         << " That used to be blocked by the compiler." << endl;
    cerr.flush();
    abort();
  }
}